

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner-unix.c
# Opt level: O0

void notify_parent_process(void)

{
  int fd_00;
  char *__nptr;
  int fd;
  char *arg;
  
  __nptr = getenv("UV_TEST_RUNNER_FD");
  if (__nptr != (char *)0x0) {
    fd_00 = atoi(__nptr);
    if (fd_00 < 3) {
      __assert_fail("fd > STDERR_FILENO",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/runner-unix.c"
                    ,0x43,"void notify_parent_process(void)");
    }
    unsetenv("UV_TEST_RUNNER_FD");
    closefd(fd_00);
  }
  return;
}

Assistant:

void notify_parent_process(void) {
  char* arg;
  int fd;

  arg = getenv("UV_TEST_RUNNER_FD");
  if (arg == NULL)
    return;

  fd = atoi(arg);
  assert(fd > STDERR_FILENO);
  unsetenv("UV_TEST_RUNNER_FD");
  closefd(fd);
}